

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.h
# Opt level: O3

Loop * uWS::Loop::get(void *existingNativeLoop)

{
  int iVar1;
  char *pcVar2;
  long *plVar3;
  Loop *pLVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  code *ctx;
  
  pcVar2 = (char *)__tls_get_addr(&PTR_0015eb98);
  if (*pcVar2 == '\0') {
    get();
  }
  plVar3 = (long *)__tls_get_addr(&PTR_0015e940);
  pLVar4 = (Loop *)*plVar3;
  if (pLVar4 == (Loop *)0x0) {
    ctx = wakeupCb;
    if (existingNativeLoop == (void *)0x0) {
      pLVar4 = (Loop *)us_create_loop(0,wakeupCb,preCb,postCb,0xf0);
      iVar1 = init(pLVar4,(EVP_PKEY_CTX *)ctx);
      pLVar4 = (Loop *)CONCAT44(extraout_var_00,iVar1);
      *plVar3 = (long)pLVar4;
      *(undefined1 *)(plVar3 + 1) = 1;
    }
    else {
      pLVar4 = (Loop *)us_create_loop(existingNativeLoop,wakeupCb,preCb,postCb,0xf0);
      iVar1 = init(pLVar4,(EVP_PKEY_CTX *)ctx);
      pLVar4 = (Loop *)CONCAT44(extraout_var,iVar1);
      *plVar3 = (long)pLVar4;
    }
  }
  return pLVar4;
}

Assistant:

static Loop *get(void *existingNativeLoop = nullptr) {
        static thread_local LoopCleaner lazyLoop;
        if (!lazyLoop.loop) {
            /* If we are given a native loop pointer we pass that to uSockets and let it deal with it */
            if (existingNativeLoop) {
                /* Todo: here we want to pass the pointer, not a boolean */
                lazyLoop.loop = create(existingNativeLoop);
                /* We cannot register automatic free here, must be manually done */
            } else {
                lazyLoop.loop = create(nullptr);
                lazyLoop.cleanMe = true;
            }
        }

        return lazyLoop.loop;
    }